

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

CoinsCachePair * __thiscall
CoinsViewCacheCursor::NextAndMaybeErase(CoinsViewCacheCursor *this,CoinsCachePair *current)

{
  long lVar1;
  CoinsCachePair *pCVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (current->second).m_next;
  if (this->m_will_erase == false) {
    if ((current->second).coin.out.nValue == -1) {
      sVar3 = Coin::DynamicMemoryUsage(&(current->second).coin);
      *this->m_usage = *this->m_usage - sVar3;
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&this->m_map->_M_h,current);
    }
    else {
      CCoinsCacheEntry::ClearFlags(&current->second);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline CoinsCachePair* NextAndMaybeErase(CoinsCachePair& current) noexcept
    {
        const auto next_entry{current.second.Next()};
        // If we are not going to erase the cache, we must still erase spent entries.
        // Otherwise clear the flags on the entry.
        if (!m_will_erase) {
            if (current.second.coin.IsSpent()) {
                m_usage -= current.second.coin.DynamicMemoryUsage();
                m_map.erase(current.first);
            } else {
                current.second.ClearFlags();
            }
        }
        return next_entry;
    }